

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_mat44_to_quatern
               (mat44 R,float *qb,float *qc,float *qd,float *qx,float *qy,float *qz,float *dx,
               float *dy,float *dz,float *qfac)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  float fVar6;
  mat33 A;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (qx != (float *)0x0) {
    *qx = R.m[0][3];
  }
  if (qy != (float *)0x0) {
    *qy = R.m[1][3];
  }
  if (qz != (float *)0x0) {
    *qz = R.m[2][3];
  }
  dVar12 = (double)R.m[0][0];
  dVar4 = (double)R.m[0][1];
  dVar14 = (double)R.m[0][2];
  dVar18 = (double)R.m[1][0];
  dVar7 = (double)R.m[1][1];
  dVar16 = (double)R.m[1][2];
  dVar9 = (double)R.m[2][0];
  dVar17 = (double)R.m[2][1];
  dVar10 = SQRT(dVar9 * dVar9 + dVar12 * dVar12 + dVar18 * dVar18);
  dVar21 = SQRT(dVar17 * dVar17 + dVar4 * dVar4 + dVar7 * dVar7);
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    dVar10 = 1.0;
    dVar9 = 0.0;
    dVar18 = 0.0;
    dVar12 = 1.0;
  }
  dVar20 = SQRT((double)R.m[2][2] * (double)R.m[2][2] + dVar14 * dVar14 + dVar16 * dVar16);
  if ((dVar21 == 0.0) && (!NAN(dVar21))) {
    dVar17 = 0.0;
    dVar21 = 1.0;
    dVar7 = 1.0;
    dVar4 = 0.0;
  }
  uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
  if ((dVar20 == 0.0) && (!NAN(dVar20))) {
    dVar20 = 1.0;
    dVar16 = 0.0;
    dVar14 = 0.0;
  }
  if (dx != (float *)0x0) {
    *dx = (float)dVar10;
  }
  if (dy != (float *)0x0) {
    *dy = (float)dVar21;
  }
  if (dz != (float *)0x0) {
    *dz = (float)dVar20;
  }
  auVar15._8_8_ = dVar18;
  auVar15._0_8_ = dVar14;
  auVar13._8_8_ = dVar4;
  auVar13._0_8_ = dVar12;
  auVar3._8_4_ = SUB84(dVar10,0);
  auVar3._0_8_ = dVar20;
  auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
  divpd(auVar15,auVar3);
  auVar1._8_4_ = SUB84(dVar21,0);
  auVar1._0_8_ = dVar10;
  auVar1._12_4_ = uVar19;
  divpd(auVar13,auVar1);
  auVar11._8_8_ = dVar17;
  auVar11._0_8_ = dVar9;
  auVar8._8_8_ = dVar16;
  auVar8._0_8_ = dVar7;
  auVar5._8_4_ = SUB84(dVar20,0);
  auVar5._0_8_ = dVar21;
  auVar5._12_4_ = (int)((ulong)dVar20 >> 0x20);
  divpd(auVar8,auVar5);
  auVar2._8_4_ = SUB84(dVar21,0);
  auVar2._0_8_ = dVar10;
  auVar2._12_4_ = uVar19;
  divpd(auVar11,auVar2);
  A.m._8_8_ = in_stack_ffffffffffffff48;
  A.m[0]._0_8_ = in_stack_ffffffffffffff40;
  A.m[1]._4_8_ = in_stack_ffffffffffffff50;
  A.m[2]._0_8_ = in_stack_ffffffffffffff58;
  A.m[2][2] = in_stack_ffffffffffffff60;
  nifti_mat33_polar(A);
  dVar16 = (double)local_4c;
  dVar7 = (double)local_48;
  dVar4 = (double)local_44;
  dVar17 = (double)local_40;
  dVar10 = (double)local_3c;
  dVar12 = (double)local_38;
  dVar9 = (double)local_34;
  dVar21 = (double)local_30;
  dVar14 = (double)local_2c;
  if ((dVar7 * dVar9 * dVar12 +
      dVar17 * dVar21 * dVar4 +
      ((dVar16 * dVar10 * dVar14 - dVar16 * dVar21 * dVar12) - dVar7 * dVar17 * dVar14)) -
      dVar10 * dVar9 * dVar4 <= 0.0) {
    if (qfac != (float *)0x0) {
      *qfac = -1.0;
    }
    dVar4 = -dVar4;
    dVar12 = -dVar12;
    dVar14 = -dVar14;
  }
  else if (qfac != (float *)0x0) {
    *qfac = 1.0;
  }
  dVar18 = dVar16 + dVar10 + dVar14 + 1.0;
  if (dVar18 <= 0.5) {
    dVar18 = (dVar16 + 1.0) - (dVar14 + dVar10);
    if (dVar18 <= 1.0) {
      dVar20 = (dVar10 + 1.0) - (dVar16 + dVar14);
      dVar21 = (dVar12 + dVar21) * 0.25;
      if (dVar20 <= 1.0) {
        dVar10 = (dVar14 + 1.0) - (dVar16 + dVar10);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar10 = dVar10 * 0.5;
        dVar18 = ((dVar4 + dVar9) * 0.25) / dVar10;
        dVar20 = dVar21 / dVar10;
        dVar21 = dVar17 - dVar7;
        dVar4 = dVar10;
      }
      else {
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar20 = dVar20 * 0.5;
        dVar18 = ((dVar7 + dVar17) * 0.25) / dVar20;
        dVar10 = dVar21 / dVar20;
        dVar21 = dVar4 - dVar9;
        dVar4 = dVar20;
      }
    }
    else {
      if (dVar18 < 0.0) {
        dVar18 = sqrt(dVar18);
      }
      else {
        dVar18 = SQRT(dVar18);
      }
      dVar18 = dVar18 * 0.5;
      dVar20 = ((dVar7 + dVar17) * 0.25) / dVar18;
      dVar10 = ((dVar4 + dVar9) * 0.25) / dVar18;
      dVar21 = dVar21 - dVar12;
      dVar4 = dVar18;
    }
    if ((dVar21 * 0.25) / dVar4 < 0.0) {
      dVar18 = -dVar18;
      dVar20 = -dVar20;
      dVar10 = -dVar10;
    }
  }
  else {
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    fVar6 = (float)(dVar18 * 0.5);
    dVar18 = (double)(((float)(dVar21 - dVar12) * 0.25) / fVar6);
    dVar20 = (double)(((float)(dVar4 - dVar9) * 0.25) / fVar6);
    dVar10 = (double)(((float)(dVar17 - dVar7) * 0.25) / fVar6);
  }
  if (qb != (float *)0x0) {
    *qb = (float)dVar18;
  }
  if (qc != (float *)0x0) {
    *qc = (float)dVar20;
  }
  if (qd != (float *)0x0) {
    *qd = (float)dVar10;
  }
  return;
}

Assistant:

void nifti_mat44_to_quatern( mat44 R ,
                             float *qb, float *qc, float *qd,
                             float *qx, float *qy, float *qz,
                             float *dx, float *dy, float *dz, float *qfac )
{
   double r11,r12,r13 , r21,r22,r23 , r31,r32,r33 ;
   double xd,yd,zd , a,b,c,d ;
   mat33 P,Q ;

   /* offset outputs are read write out of input matrix  */

   ASSIF(qx,R.m[0][3]) ; ASSIF(qy,R.m[1][3]) ; ASSIF(qz,R.m[2][3]) ;

   /* load 3x3 matrix into local variables */

   r11 = R.m[0][0] ; r12 = R.m[0][1] ; r13 = R.m[0][2] ;
   r21 = R.m[1][0] ; r22 = R.m[1][1] ; r23 = R.m[1][2] ;
   r31 = R.m[2][0] ; r32 = R.m[2][1] ; r33 = R.m[2][2] ;

   /* compute lengths of each column; these determine grid spacings  */

   xd = sqrt( r11*r11 + r21*r21 + r31*r31 ) ;
   yd = sqrt( r12*r12 + r22*r22 + r32*r32 ) ;
   zd = sqrt( r13*r13 + r23*r23 + r33*r33 ) ;

   /* if a column length is zero, patch the trouble */

   if( xd == 0.0l ){ r11 = 1.0l ; r21 = r31 = 0.0l ; xd = 1.0l ; }
   if( yd == 0.0l ){ r22 = 1.0l ; r12 = r32 = 0.0l ; yd = 1.0l ; }
   if( zd == 0.0l ){ r33 = 1.0l ; r13 = r23 = 0.0l ; zd = 1.0l ; }

   /* assign the output lengths */

   ASSIF(dx,(float)xd) ; ASSIF(dy,(float)yd) ; ASSIF(dz,(float)zd) ;

   /* normalize the columns */

   r11 /= xd ; r21 /= xd ; r31 /= xd ;
   r12 /= yd ; r22 /= yd ; r32 /= yd ;
   r13 /= zd ; r23 /= zd ; r33 /= zd ;

   /* At this point, the matrix has normal columns, but we have to allow
      for the fact that the hideous user may not have given us a matrix
      with orthogonal columns.

      So, now find the orthogonal matrix closest to the current matrix.

      One reason for using the polar decomposition to get this
      orthogonal matrix, rather than just directly orthogonalizing
      the columns, is so that inputting the inverse matrix to R
      will result in the inverse orthogonal matrix at this point.
      If we just orthogonalized the columns, this wouldn't necessarily hold. */

   Q.m[0][0] = (float)r11 ; Q.m[0][1] = (float)r12 ; Q.m[0][2] = (float)r13 ; /* load Q */
   Q.m[1][0] = (float)r21 ; Q.m[1][1] = (float)r22 ; Q.m[1][2] = (float)r23 ;
   Q.m[2][0] = (float)r31 ; Q.m[2][1] = (float)r32 ; Q.m[2][2] = (float)r33 ;

   P = nifti_mat33_polar(Q) ;  /* P is orthog matrix closest to Q */

   r11 = P.m[0][0] ; r12 = P.m[0][1] ; r13 = P.m[0][2] ; /* unload */
   r21 = P.m[1][0] ; r22 = P.m[1][1] ; r23 = P.m[1][2] ;
   r31 = P.m[2][0] ; r32 = P.m[2][1] ; r33 = P.m[2][2] ;

   /*                            [ r11 r12 r13 ]               */
   /* at this point, the matrix  [ r21 r22 r23 ] is orthogonal */
   /*                            [ r31 r32 r33 ]               */

   /* compute the determinant to determine if it is proper */

   zd = r11*r22*r33-r11*r32*r23-r21*r12*r33
       +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;  /* should be -1 or 1 */

   if( zd > 0 ){             /* proper */
     ASSIF(qfac,1.0f) ;
   } else {                  /* improper ==> flip 3rd column */
     ASSIF(qfac,-1.0f) ;
     r13 = -r13 ; r23 = -r23 ; r33 = -r33 ;
   }

   /* now, compute quaternion parameters */

   a = r11 + r22 + r33 + 1.0l ;

   if( a > 0.5l ){                /* simplest case */
     a = 0.5l * sqrt(a) ;
     b = 0.25l * (r32-r23) / a ;
     c = 0.25l * (r13-r31) / a ;
     d = 0.25l * (r21-r12) / a ;
   } else {                       /* trickier case */
     xd = 1.0 + r11 - (r22+r33) ;  /* 4*b*b */
     yd = 1.0 + r22 - (r11+r33) ;  /* 4*c*c */
     zd = 1.0 + r33 - (r11+r22) ;  /* 4*d*d */
     if( xd > 1.0 ){
       b = 0.5l * sqrt(xd) ;
       c = 0.25l* (r12+r21) / b ;
       d = 0.25l* (r13+r31) / b ;
       a = 0.25l* (r32-r23) / b ;
     } else if( yd > 1.0 ){
       c = 0.5l * sqrt(yd) ;
       b = 0.25l* (r12+r21) / c ;
       d = 0.25l* (r23+r32) / c ;
       a = 0.25l* (r13-r31) / c ;
     } else {
       d = 0.5l * sqrt(zd) ;
       b = 0.25l* (r13+r31) / d ;
       c = 0.25l* (r23+r32) / d ;
       a = 0.25l* (r21-r12) / d ;
     }
     if( a < 0.0l ){ b=-b ; c=-c ; d=-d; a=-a; }
   }

   ASSIF(qb,(float)b) ; ASSIF(qc,(float)c) ; ASSIF(qd,(float)d) ;
   return ;
}